

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::LogUnused(cmMakefile *this,char *reason,string *name)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string path;
  ostringstream msg;
  allocator local_1fb;
  allocator local_1fa;
  allocator local_1f9;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [376];
  
  if (this->WarnUnused != true) {
    return;
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  if ((this->ExecutionStatusStack).
      super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->ExecutionStatusStack).
      super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    GetCurrentSourceDirectory(this);
    std::__cxx11::string::assign((char *)&local_1d8);
    std::__cxx11::string::append((char *)&local_1d8);
  }
  else {
    GetExecutionContext((cmListFileContext *)local_198,this);
    std::__cxx11::string::operator=((string *)&local_1d8,(string *)(local_198 + 0x20));
    cmListFileContext::~cmListFileContext((cmListFileContext *)local_198);
  }
  if (this->CheckSystemVars == false) {
    pcVar2 = GetHomeDirectory(this);
    std::__cxx11::string::string((string *)local_198,pcVar2,&local_1f9);
    bVar1 = cmsys::SystemTools::IsSubDirectory(&local_1d8,(string *)local_198);
    if (bVar1) {
      std::__cxx11::string::~string((string *)local_198);
    }
    else {
      pcVar2 = GetHomeOutputDirectory(this);
      std::__cxx11::string::string((string *)&local_1f8,pcVar2,&local_1fa);
      bVar1 = cmsys::SystemTools::IsSubDirectory(&local_1d8,&local_1f8);
      if (!bVar1) {
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)local_198);
        goto LAB_0031035e;
      }
      std::__cxx11::string::string((string *)&local_1b8,"/CMakeFiles",&local_1fb);
      bVar1 = cmsys::SystemTools::IsSubDirectory(&local_1d8,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)local_198);
      if (bVar1) goto LAB_0031035e;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  poVar3 = std::operator<<((ostream *)local_198,"unused variable (");
  poVar3 = std::operator<<(poVar3,reason);
  poVar3 = std::operator<<(poVar3,") \'");
  poVar3 = std::operator<<(poVar3,(string *)name);
  std::operator<<(poVar3,"\'");
  std::__cxx11::stringbuf::str();
  IssueMessage(this,AUTHOR_WARNING,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
LAB_0031035e:
  std::__cxx11::string::~string((string *)&local_1d8);
  return;
}

Assistant:

void cmMakefile::LogUnused(const char* reason, const std::string& name) const
{
  if (this->WarnUnused) {
    std::string path;
    if (!this->ExecutionStatusStack.empty()) {
      path = this->GetExecutionContext().FilePath;
    } else {
      path = this->GetCurrentSourceDirectory();
      path += "/CMakeLists.txt";
    }

    if (this->CheckSystemVars ||
        cmSystemTools::IsSubDirectory(path, this->GetHomeDirectory()) ||
        (cmSystemTools::IsSubDirectory(path, this->GetHomeOutputDirectory()) &&
         !cmSystemTools::IsSubDirectory(path,
                                        cmake::GetCMakeFilesDirectory()))) {
      std::ostringstream msg;
      msg << "unused variable (" << reason << ") \'" << name << "\'";
      this->IssueMessage(cmake::AUTHOR_WARNING, msg.str());
    }
  }
}